

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_fsm.cc
# Opt level: O3

void init_fsm(module *m)

{
  class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *pcVar1;
  class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *pcVar2;
  code *local_1a8;
  undefined8 local_1a0;
  code *local_198;
  undefined8 local_190;
  code *local_188;
  undefined8 local_180;
  code *local_178;
  undefined8 local_170;
  code *local_168;
  undefined8 local_160;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  code *local_128;
  undefined8 local_120;
  code *local_118;
  undefined8 local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  object local_38;
  undefined8 local_30;
  class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_> local_28;
  return_value_policy local_1c [4];
  
  pybind11::class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_>::class_<>
            (&local_28,(m->super_object).super_handle.m_ptr,"FSM");
  pybind11::class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (&local_28,"__init__",(type *)&local_58,(is_new_style_constructor *)&local_48);
  pybind11::class_<kratos::FSM,_std::shared_ptr<kratos::FSM>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (&local_28,"__init__",(type *)&local_58,(is_new_style_constructor *)&local_48);
  local_58 = kratos::FSM::add_state;
  local_50 = 0;
  local_1c[0] = reference;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     ((class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)&local_28,"add_state",
                      (offset_in_Var_to_subr *)&local_58,local_1c);
  local_48 = kratos::FSM::add_state;
  local_40 = 0;
  local_1c[1] = 5;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&),pybind11::return_value_policy>
                     (pcVar1,"add_state",(offset_in_Var_to_subr *)&local_48,local_1c + 1);
  local_a8 = kratos::FSM::get_state;
  local_a0 = 0;
  local_1c[2] = 5;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::shared_ptr<kratos::FSMState>(kratos::FSM::*)(std::__cxx11::string_const&)const,pybind11::return_value_policy>
                     (pcVar1,"get_state",(offset_in_Var_to_subr *)&local_a8,local_1c + 2);
  local_98 = kratos::FSM::set_start_state;
  local_90 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"set_start_state",(offset_in_Var_to_subr *)&local_98);
  local_88 = kratos::FSM::set_start_state;
  local_80 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::FSMState>const&)>
                     (pcVar1,"set_start_state",(offset_in_Var_to_subr *)&local_88);
  local_78 = kratos::FSM::set_start_state;
  local_70 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar1,"set_start_state",(offset_in_Var_to_subr *)&local_78);
  local_68 = kratos::FSM::set_start_state;
  local_60 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::FSMState>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar1,"set_start_state",(offset_in_Var_to_subr *)&local_68);
  local_38.super_handle.m_ptr = (handle)kratos::FSM::output;
  local_30 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"output",(offset_in_Var_to_subr *)&local_38);
  local_1a8 = kratos::FSM::output;
  local_1a0 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::Var>const&)>
                     (pcVar1,"output",(offset_in_Var_to_subr *)&local_1a8);
  local_198 = kratos::FSM::output;
  local_190 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar1,"output",(offset_in_Var_to_subr *)&local_198);
  local_188 = kratos::FSM::output;
  local_180 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar1,"output",(offset_in_Var_to_subr *)&local_188);
  local_178 = kratos::FSM::fsm_name_abi_cxx11_;
  local_170 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string_const&(kratos::FSM::*)()const>
                     (pcVar1,"fsm_name",(offset_in_Var_to_subr *)&local_178);
  local_168 = kratos::FSM::outputs;
  local_160 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::unordered_map<kratos::Var*,kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<std::pair<kratos::Var*const,kratos::Var*>>>const&(kratos::FSM::*)()const>
                     (pcVar1,"outputs",(offset_in_Var_to_subr *)&local_168);
  local_158 = kratos::FSM::dot_graph_abi_cxx11_;
  local_150 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string(kratos::FSM::*)()>
                     (pcVar1,"dot_graph",(offset_in_Var_to_subr *)&local_158);
  local_148 = kratos::FSM::dot_graph;
  local_140 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"dot_graph",(offset_in_Var_to_subr *)&local_148);
  local_138 = kratos::FSM::output_table_abi_cxx11_;
  local_130 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::__cxx11::string(kratos::FSM::*)()>
                     (pcVar1,"output_table",(offset_in_Var_to_subr *)&local_138);
  local_128 = kratos::FSM::output_table;
  local_120 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"output_table",(offset_in_Var_to_subr *)&local_128);
  local_118 = kratos::FSM::set_moore;
  local_110 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(bool)>(pcVar1,"set_moore",(offset_in_Var_to_subr *)&local_118);
  local_108 = kratos::FSM::is_moore;
  local_100 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<bool(kratos::FSM::*)()const>(pcVar1,"is_moore",(offset_in_Var_to_subr *)&local_108);
  local_f8 = kratos::FSM::add_child_fsm;
  local_f0 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<void(kratos::FSM::*)(kratos::FSM*)>
                     (pcVar1,"add_child_fsm",(offset_in_Var_to_subr *)&local_f8);
  local_e8 = kratos::FSM::get_all_child_fsm;
  local_e0 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def<std::vector<kratos::FSM*,std::allocator<kratos::FSM*>>(kratos::FSM::*)()const>
                     (pcVar1,"get_all_child_fsm",(offset_in_Var_to_subr *)&local_e8);
  local_d8 = kratos::FSM::current_state_var;
  local_d0 = 0;
  local_1c[3] = 5;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::
           def_property_readonly<kratos::EnumVar*(kratos::FSM::*)()const,pybind11::return_value_policy>
                     (pcVar1,"current_state",(offset_in_Var_to_subr *)&local_d8,local_1c + 3);
  local_c8 = kratos::FSM::realize;
  local_c0 = 0;
  pcVar1 = (class_<kratos::FSM,std::shared_ptr<kratos::FSM>> *)
           pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::def<void(kratos::FSM::*)()>
                     (pcVar1,"realize",(offset_in_Var_to_subr *)&local_c8);
  local_b8 = kratos::FSM::set_reset_high;
  local_b0 = 0;
  pybind11::class_<kratos::FSM,std::shared_ptr<kratos::FSM>>::def<void(kratos::FSM::*)(bool)>
            (pcVar1,"set_reset_high",(offset_in_Var_to_subr *)&local_b8);
  pybind11::object::~object((object *)&local_28);
  pybind11::class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_>::class_<>
            ((class_<kratos::FSMState,_std::shared_ptr<kratos::FSMState>_> *)&local_38,
             (m->super_object).super_handle.m_ptr,"FSMState");
  local_58 = kratos::FSMState::next;
  local_50 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&)>
                     ((class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)&local_38,"next"
                      ,(offset_in_Var_to_subr *)&local_58);
  local_48 = kratos::FSMState::next;
  local_40 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::FSMState>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"next",(offset_in_Var_to_subr *)&local_48);
  local_a8 = kratos::FSMState::output;
  local_a0 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&)>
                     (pcVar2,"output",(offset_in_Var_to_subr *)&local_a8);
  local_98 = kratos::FSMState::output;
  local_90 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,long)>
                     (pcVar2,"output",(offset_in_Var_to_subr *)&local_98);
  local_88 = kratos::FSMState::output;
  local_80 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>const&,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"output",(offset_in_Var_to_subr *)&local_88);
  local_78 = kratos::FSMState::output;
  local_70 = 0;
  pcVar2 = (class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>> *)
           pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
           def<void(kratos::FSMState::*)(std::shared_ptr<kratos::Var>const&,long,std::pair<std::__cxx11::string,unsigned_int>const&)>
                     (pcVar2,"output",(offset_in_Var_to_subr *)&local_78);
  local_68 = kratos::FSMState::name_abi_cxx11_;
  local_60 = 0;
  pybind11::class_<kratos::FSMState,std::shared_ptr<kratos::FSMState>>::
  def_property_readonly<std::__cxx11::string_const&(kratos::FSMState::*)()const>
            (pcVar2,"name",(offset_in_Var_to_subr *)&local_68);
  pybind11::object::~object(&local_38);
  return;
}

Assistant:

void init_fsm(py::module &m) {
    using namespace kratos;
    py::class_<FSM, std::shared_ptr<FSM>>(m, "FSM")
        .def(py::init<std::string, Generator *>())
        .def(py::init<std::string, Generator *, std::shared_ptr<Var>, std::shared_ptr<Var>>())
        .def("add_state", py::overload_cast<const std::string &>(&FSM::add_state),
             py::return_value_policy::reference)
        .def("add_state",
             py::overload_cast<const std::string &, const std::pair<std::string, uint32_t> &>(
                 &FSM::add_state),
             py::return_value_policy::reference)
        .def("get_state", &FSM::get_state, py::return_value_policy::reference)
        .def("set_start_state", py::overload_cast<const std::string &>(&FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::shared_ptr<FSMState> &>(&FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::string &, const std::pair<std::string, uint32_t> &>(
                 &FSM::set_start_state))
        .def("set_start_state",
             py::overload_cast<const std::shared_ptr<FSMState> &,
                               const std::pair<std::string, uint32_t> &>(&FSM::set_start_state))
        .def("output", py::overload_cast<const std::string &>(&FSM::output))
        .def("output", py::overload_cast<const std::shared_ptr<Var> &>(&FSM::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &>(
                 &FSM::output))
        .def("output",
             py::overload_cast<const std::string &, const std::shared_ptr<Var> &>(&FSM::output))
        .def("fsm_name", &FSM::fsm_name)
        .def("outputs", &FSM::outputs)
        .def("dot_graph", py::overload_cast<>(&FSM::dot_graph))
        .def("dot_graph", py::overload_cast<const std::string &>(&FSM::dot_graph))
        .def("output_table", py::overload_cast<>(&FSM::output_table))
        .def("output_table", py::overload_cast<const std::string &>(&FSM::output_table))
        .def("set_moore", &FSM::set_moore)
        .def("is_moore", &FSM::is_moore)
        .def("add_child_fsm", &FSM::add_child_fsm)
        .def("get_all_child_fsm", &FSM::get_all_child_fsm)
        .def_property_readonly("current_state", &FSM::current_state_var,
                               // don't want Python to free it
                               py::return_value_policy::reference)
        .def("realize", &FSM::realize)
        .def("set_reset_high", &FSM::set_reset_high);

    py::class_<FSMState, std::shared_ptr<FSMState>>(m, "FSMState")
        .def("next",
             py::overload_cast<const std::shared_ptr<FSMState> &, const std::shared_ptr<Var> &>(
                 &FSMState::next))
        .def("next",
             py::overload_cast<const std::shared_ptr<FSMState> &, const std::shared_ptr<Var> &,
                               const std::pair<std::string, uint32_t> &>(&FSMState::next))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &>(
                 &FSMState::output))
        .def("output", py::overload_cast<const std::shared_ptr<Var> &, int64_t>(&FSMState::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, const std::shared_ptr<Var> &,
                               const std::pair<std::string, uint32_t> &>(&FSMState::output))
        .def("output",
             py::overload_cast<const std::shared_ptr<Var> &, int64_t,
                               const std::pair<std::string, uint32_t> &>(&FSMState::output))
        .def_property_readonly("name", &FSMState::name);
}